

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

bool D_LoadDehLump(int lumpnum)

{
  bool bVar1;
  char *s;
  undefined1 local_18 [20];
  int lumpnum_local;
  
  local_18._12_4_ = lumpnum;
  PatchSize = FWadCollection::LumpLength(&Wads,lumpnum);
  FWadCollection::GetLumpFullPath((FWadCollection *)local_18,0xdb0460);
  s = FString::operator_cast_to_char_((FString *)local_18);
  PatchName = copystring(s);
  FString::~FString((FString *)local_18);
  PatchFile = (char *)operator_new__((long)(PatchSize + 1));
  FWadCollection::ReadLump(&Wads,local_18._12_4_,PatchFile);
  PatchFile[PatchSize] = '\0';
  bVar1 = DoDehPatch();
  return bVar1;
}

Assistant:

bool D_LoadDehLump(int lumpnum)
{
	PatchSize = Wads.LumpLength(lumpnum);

	PatchName = copystring(Wads.GetLumpFullPath(lumpnum));
	PatchFile = new char[PatchSize + 1];
	Wads.ReadLump(lumpnum, PatchFile);
	PatchFile[PatchSize] = '\0';		// terminate with a '\0' character
	return DoDehPatch();
}